

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialBeamANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMaterialBeamANCF::Calc_E_eps_Nu
          (ChMaterialBeamANCF *this,ChVector<double> *E,ChVector<double> *nu,ChVector<double> *G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar1 = nu->m_data[0];
  dVar2 = nu->m_data[1];
  dVar3 = E->m_data[0];
  dVar4 = E->m_data[2];
  dVar5 = nu->m_data[2];
  dVar1 = (((1.0 - (dVar1 * dVar1 * E->m_data[1]) / dVar3) - (dVar2 * dVar2 * dVar4) / dVar3) -
          (dVar5 * dVar5 * dVar4) / E->m_data[1]) -
          (dVar4 * (dVar1 + dVar1) * dVar2 * dVar5) / dVar3;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1d] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1e] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1f] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x20] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x21] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x22] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x23] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x18] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x19] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1a] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1b] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1d] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1e] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1f] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x10] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x11] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x12] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x13] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x14] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x15] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x16] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x17] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[8] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[9] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[10] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xb] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xc] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xd] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xe] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xf] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[1] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[2] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[3] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[4] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[5] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[6] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[7] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0] = ((1.0 - (nu->m_data[2] * nu->m_data[2] * E->m_data[2]) / E->m_data[1]) / dVar1 + -1.0)
             * E->m_data[0];
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[7] = ((1.0 - (nu->m_data[1] * nu->m_data[1] * E->m_data[2]) / E->m_data[0]) / dVar1 + -1.0)
             * E->m_data[1];
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x15] = ((1.0 - (nu->m_data[0] * nu->m_data[0] * E->m_data[1]) / E->m_data[0]) / dVar1 +
                -1.0) * E->m_data[2];
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[1] = (E->m_data[1] *
             ((nu->m_data[1] * nu->m_data[2] * E->m_data[2]) / E->m_data[1] + nu->m_data[0])) /
             dVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = nu->m_data[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = nu->m_data[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = nu->m_data[1];
  auVar6 = vfmadd213sd_fma(auVar10,auVar8,auVar6);
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[3] = (auVar6._0_8_ * E->m_data[2]) / dVar1;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[6] = (E->m_data[1] *
             ((nu->m_data[1] * nu->m_data[2] * E->m_data[2]) / E->m_data[1] + nu->m_data[0])) /
             dVar1;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[9] = (((nu->m_data[1] * nu->m_data[0] * E->m_data[1]) / E->m_data[0] + nu->m_data[2]) *
             E->m_data[2]) / dVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = nu->m_data[0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = nu->m_data[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = nu->m_data[1];
  auVar6 = vfmadd213sd_fma(auVar11,auVar9,auVar7);
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x12] = (auVar6._0_8_ * E->m_data[2]) / dVar1;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x13] = (((nu->m_data[1] * nu->m_data[0] * E->m_data[1]) / E->m_data[0] + nu->m_data[2]) *
                E->m_data[2]) / dVar1;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xe] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = 0.0;
  (this->m_E_eps_Nu).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x23] = 0.0;
  return;
}

Assistant:

void ChMaterialBeamANCF::Calc_E_eps_Nu(const ChVector<>& E, const ChVector<>& nu, const ChVector<>& G) {
    double delta = 1.0 - (nu.x() * nu.x()) * E.y() / E.x() - (nu.y() * nu.y()) * E.z() / E.x() -
                   (nu.z() * nu.z()) * E.z() / E.y() - 2.0 * nu.x() * nu.y() * nu.z() * E.z() / E.x();
    m_E_eps_Nu.setZero();
    m_E_eps_Nu(0, 0) = E.x() * ((1.0 - (nu.z() * nu.z()) * E.z() / E.y()) / delta - 1.0);
    m_E_eps_Nu(1, 1) = E.y() * ((1.0 - (nu.y() * nu.y()) * E.z() / E.x()) / delta - 1.0);
    m_E_eps_Nu(3, 3) = E.z() * ((1.0 - (nu.x() * nu.x()) * E.y() / E.x()) / delta - 1.0);
    m_E_eps_Nu(0, 1) = E.y() * (nu.x() + nu.y() * nu.z() * E.z() / E.y()) / delta;
    m_E_eps_Nu(0, 3) = E.z() * (nu.y() + nu.z() * nu.x()) / delta;
    m_E_eps_Nu(1, 0) = E.y() * (nu.x() + nu.y() * nu.z() * E.z() / E.y()) / delta;
    m_E_eps_Nu(1, 3) = E.z() * (nu.z() + nu.y() * nu.x() * E.y() / E.x()) / delta;
    m_E_eps_Nu(3, 0) = E.z() * (nu.y() + nu.z() * nu.x()) / delta;
    m_E_eps_Nu(3, 1) = E.z() * (nu.z() + nu.y() * nu.x() * E.y() / E.x()) / delta;

    m_E_eps_Nu(2, 2) = 0.0;
    m_E_eps_Nu(4, 4) = 0.0;
    m_E_eps_Nu(5, 5) = 0.0;
}